

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

int32_t u_strCompareIter_63(UCharIterator *iter1,UCharIterator *iter2,UBool codePointOrder)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((iter1 != iter2) && (iter1 != (UCharIterator *)0x0)) && (iter2 != (UCharIterator *)0x0)) {
    (*iter1->move)(iter1,0,UITER_START);
    (*iter2->move)(iter2,0,UITER_START);
    do {
      uVar1 = (*(code *)iter1->next)(iter1);
      uVar2 = (*(code *)iter2->next)(iter2);
      if (uVar1 != uVar2) {
        if (((codePointOrder == '\0') || ((int)uVar1 < 0xd800)) || ((int)uVar2 < 0xd800))
        goto LAB_002e4108;
        if ((0xdbff < uVar1) ||
           (uVar3 = (*(code *)iter1->current)(iter1), (uVar3 & 0xfffffc00) != 0xdc00)) {
          if ((uVar1 & 0x7ffffc00) == 0xdc00) {
            (*(code *)iter1->previous)(iter1);
            uVar3 = (*(code *)iter1->previous)(iter1);
            if ((uVar3 & 0xfffffc00) == 0xd800) goto LAB_002e40bf;
          }
          uVar1 = uVar1 - 0x2800;
        }
LAB_002e40bf:
        if ((0xdbff < uVar2) ||
           (uVar3 = (*(code *)iter2->current)(iter2), (uVar3 & 0xfffffc00) != 0xdc00)) {
          if ((uVar2 & 0x7ffffc00) == 0xdc00) {
            (*(code *)iter2->previous)(iter2);
            uVar3 = (*(code *)iter2->previous)(iter2);
            if ((uVar3 & 0xfffffc00) == 0xd800) goto LAB_002e4108;
          }
          uVar2 = uVar2 - 0x2800;
        }
LAB_002e4108:
        return uVar1 - uVar2;
      }
    } while (uVar1 != 0xffffffff);
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_strCompareIter(UCharIterator *iter1, UCharIterator *iter2, UBool codePointOrder) {
    UChar32 c1, c2;

    /* argument checking */
    if(iter1==NULL || iter2==NULL) {
        return 0; /* bad arguments */
    }
    if(iter1==iter2) {
        return 0; /* identical iterators */
    }

    /* reset iterators to start? */
    iter1->move(iter1, 0, UITER_START);
    iter2->move(iter2, 0, UITER_START);

    /* compare identical prefixes - they do not need to be fixed up */
    for(;;) {
        c1=iter1->next(iter1);
        c2=iter2->next(iter2);
        if(c1!=c2) {
            break;
        }
        if(c1==-1) {
            return 0;
        }
    }

    /* if both values are in or above the surrogate range, fix them up */
    if(c1>=0xd800 && c2>=0xd800 && codePointOrder) {
        /* subtract 0x2800 from BMP code points to make them smaller than supplementary ones */
        if(
            (c1<=0xdbff && U16_IS_TRAIL(iter1->current(iter1))) ||
            (U16_IS_TRAIL(c1) && (iter1->previous(iter1), U16_IS_LEAD(iter1->previous(iter1))))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c1-=0x2800;
        }

        if(
            (c2<=0xdbff && U16_IS_TRAIL(iter2->current(iter2))) ||
            (U16_IS_TRAIL(c2) && (iter2->previous(iter2), U16_IS_LEAD(iter2->previous(iter2))))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c2-=0x2800;
        }
    }

    /* now c1 and c2 are in the requested (code unit or code point) order */
    return (int32_t)c1-(int32_t)c2;
}